

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopPeeling::InsertCanonicalInductionVariable
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  BasicBlock *this_01;
  pointer pOVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t type;
  uint32_t uVar7;
  array<signed_char,_4UL> aVar8;
  iterator iVar9;
  Instruction *pIVar10;
  Instruction *this_02;
  ulong uVar11;
  ulong uVar12;
  iterator iVar13;
  InstructionBuilder builder;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  InstructionBuilder local_50;
  
  pIVar10 = this->original_loop_canonical_induction_variable_;
  if (pIVar10 == (Instruction *)0x0) {
    this_01 = this->cloned_loop_->loop_latch_;
    pIVar10 = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar10 == (Instruction *)0x0) ||
       ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    iVar13.node_ = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    pIVar10 = BasicBlock::GetMergeInst(this_01);
    if (pIVar10 != (Instruction *)0x0) {
      iVar13.node_ = ((iVar13.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                     previous_node_;
    }
    pIVar1 = this->context_;
    local_50.parent_ = IRContext::get_instr_block(pIVar1,iVar13.node_);
    local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
    local_50.context_ = pIVar1;
    local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)iVar13.node_;
    pIVar10 = InstructionBuilder::GetIntConstant<unsigned_int>(&local_50,1,this->int_type_->signed_)
    ;
    uVar5 = 0;
    uVar4 = 0;
    if (pIVar10->has_type_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar10,0);
    }
    bVar3 = pIVar10->has_result_id_;
    if ((bool)bVar3 == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      bVar3 = pIVar10->has_result_id_;
    }
    type = 0;
    uVar6 = 0;
    if ((bVar3 & 1) != 0) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    this_02 = InstructionBuilder::AddIAdd(&local_50,uVar4,uVar5,uVar6);
    iVar13.node_ = (this->cloned_loop_->loop_header_->insts_).
                   super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_50.parent_ = IRContext::get_instr_block(local_50.context_,iVar13.node_);
    local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)iVar13.node_;
    if (pIVar10->has_type_id_ == true) {
      type = Instruction::GetSingleWordOperand(pIVar10,0);
    }
    uVar5 = 0;
    pIVar10 = InstructionBuilder::GetIntConstant<unsigned_int>(&local_50,0,this->int_type_->signed_)
    ;
    uVar4 = 0;
    if (pIVar10->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    pIVar10 = (this->cloned_loop_->loop_preheader_->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar10->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    uVar7 = 0;
    uVar6 = 0;
    if (this_02->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    pIVar10 = (this->cloned_loop_->loop_latch_->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar10->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    local_78._0_8_ = operator_new(0x10);
    local_78._8_8_ = local_78._0_8_ + 0x10;
    *(uint32_t *)local_78._0_8_ = uVar4;
    *(uint32_t *)(local_78._0_8_ + 4) = uVar5;
    *(uint32_t *)(local_78._0_8_ + 8) = uVar6;
    *(uint32_t *)(local_78._0_8_ + 0xc) = uVar7;
    aVar8._M_elems[0] = '\0';
    aVar8._M_elems[1] = '\0';
    aVar8._M_elems[2] = '\0';
    aVar8._M_elems[3] = '\0';
    local_78._16_8_ = local_78._8_8_;
    pIVar10 = InstructionBuilder::AddPhi
                        (&local_50,type,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
    this->canonical_induction_variable_ = pIVar10;
    if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
      pIVar10 = this->canonical_induction_variable_;
    }
    if (pIVar10->has_result_id_ == true) {
      aVar8._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_)
      ;
    }
    local_78._24_8_ = local_78 + 0x10;
    local_78._0_8_ = &PTR__SmallVector_003d7c78;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._16_4_ = aVar8._M_elems;
    local_78._8_8_ = (pointer)0x1;
    uVar11 = (ulong)(this_02->has_result_id_ & 1) + 1;
    if (this_02->has_type_id_ == false) {
      uVar11 = (ulong)this_02->has_result_id_;
    }
    pOVar2 = (this_02->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = ((long)(this_02->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
             -0x5555555555555555;
    if (uVar12 < uVar11 || uVar12 - uVar11 == 0) {
      __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2b8,
                    "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                   );
    }
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
               (ulong)(uint)((int)uVar11 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_78);
    local_78._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    analysis::DefUseManager::AnalyzeInstUse
              ((pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               this_02);
    if (this->do_while_form_ == true) {
      this->canonical_induction_variable_ = this_02;
    }
  }
  else {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
      pIVar10 = this->original_loop_canonical_induction_variable_;
    }
    this_00 = (pIVar1->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_78._0_4_ = 0;
    if (pIVar10->has_result_id_ == true) {
      local_78._0_4_ = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    iVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(clone_results->value_map_)._M_h,(key_type_conflict *)local_78);
    if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pIVar10 = analysis::DefUseManager::GetDef
                        (this_00,*(uint32_t *)
                                  ((long)iVar9.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur + 0xc));
    this->canonical_induction_variable_ = pIVar10;
  }
  return;
}

Assistant:

void LoopPeeling::InsertCanonicalInductionVariable(
    LoopUtils::LoopCloningResult* clone_results) {
  if (original_loop_canonical_induction_variable_) {
    canonical_induction_variable_ =
        context_->get_def_use_mgr()->GetDef(clone_results->value_map_.at(
            original_loop_canonical_induction_variable_->result_id()));
    return;
  }

  BasicBlock::iterator insert_point = GetClonedLoop()->GetLatchBlock()->tail();
  if (GetClonedLoop()->GetLatchBlock()->GetMergeInst()) {
    --insert_point;
  }
  InstructionBuilder builder(
      context_, &*insert_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* uint_1_cst =
      builder.GetIntConstant<uint32_t>(1, int_type_->IsSigned());
  // Create the increment.
  // Note that we do "1 + 1" here, one of the operand should the phi
  // value but we don't have it yet. The operand will be set latter.
  Instruction* iv_inc = builder.AddIAdd(
      uint_1_cst->type_id(), uint_1_cst->result_id(), uint_1_cst->result_id());

  builder.SetInsertPoint(&*GetClonedLoop()->GetHeaderBlock()->begin());

  canonical_induction_variable_ = builder.AddPhi(
      uint_1_cst->type_id(),
      {builder.GetIntConstant<uint32_t>(0, int_type_->IsSigned())->result_id(),
       GetClonedLoop()->GetPreHeaderBlock()->id(), iv_inc->result_id(),
       GetClonedLoop()->GetLatchBlock()->id()});
  // Connect everything.
  iv_inc->SetInOperand(0, {canonical_induction_variable_->result_id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(iv_inc);

  // If do-while form, use the incremented value.
  if (do_while_form_) {
    canonical_induction_variable_ = iv_inc;
  }
}